

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmem.c
# Opt level: O3

void * luaM_growaux_(lua_State *L,void *block,int *size,size_t size_elems,int limit,char *what)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = *size;
  if (iVar1 < limit / 2) {
    limit = 4;
    if (4 < iVar1 * 2) {
      limit = iVar1 * 2;
    }
  }
  else if (limit <= iVar1) {
    luaG_runerror(L,"too many %s (limit is %d)",what,(ulong)(uint)limit);
  }
  pvVar2 = luaM_realloc_(L,block,(long)iVar1 * size_elems,size_elems * (long)limit);
  *size = limit;
  return pvVar2;
}

Assistant:

void *luaM_growaux_ (lua_State *L, void *block, int *size, size_t size_elems,
                     int limit, const char *what) {
  void *newblock;
  int newsize;
  if (*size >= limit/2) {  /* cannot double it? */
    if (*size >= limit)  /* cannot grow even a little? */
      luaG_runerror(L, "too many %s (limit is %d)", what, limit);
    newsize = limit;  /* still have at least one free place */
  }
  else {
    newsize = (*size)*2;
    if (newsize < MINSIZEARRAY)
      newsize = MINSIZEARRAY;  /* minimum size */
  }
  newblock = luaM_reallocv(L, block, *size, newsize, size_elems);
  *size = newsize;  /* update only when everything else is OK */
  return newblock;
}